

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

short filter_run_buf(filter *f,short *in,float *out,int step,int len)

{
  float *__dest;
  float fVar1;
  float *buffer;
  int pointer;
  int iStack_2c;
  short maxval;
  int od;
  int id;
  int len_local;
  int step_local;
  float *out_local;
  short *in_local;
  filter *f_local;
  
  iStack_2c = 0;
  pointer = 0;
  buffer._6_2_ = 0;
  buffer._0_4_ = f->pointer;
  __dest = f->buffer;
  for (; pointer < len; pointer = pointer + 1) {
    __dest[(int)buffer] = (float)(int)in[iStack_2c];
    if (buffer._6_2_ < in[iStack_2c]) {
      buffer._6_2_ = in[iStack_2c];
    }
    fVar1 = filter_mac(__dest + ((int)buffer - f->length),f->taps,f->length);
    out[pointer] = fVar1;
    buffer._0_4_ = (int)buffer + 1;
    if ((int)buffer == 0x400) {
      memcpy(__dest,(void *)((long)f + (long)f->length * -4 + 0x1010),(long)f->length << 2);
      buffer._0_4_ = f->length;
    }
    iStack_2c = step + iStack_2c;
  }
  f->pointer = (int)buffer;
  return buffer._6_2_;
}

Assistant:

short filter_run_buf(struct filter *f, short *in, float *out, int step, int len)
{
	int id = 0;
	int od = 0;
	short maxval = 0;
	int pointer = f->pointer;
	float *buffer = f->buffer;
	
	while (od < len) {
	        buffer[pointer] = in[id];
		
		// look for peak volume
		if (in[id] > maxval)
			maxval = in[id];
		
		#ifndef __HAVE_ARCH_MAC	
		out[od] = filter_mac(&buffer[pointer - f->length], f->taps, f->length);
		#else
		out[od] = mac(&buffer[pointer - f->length], f->taps, f->length);
		#endif
		pointer++;
		
		/* the buffer is much smaller than the incoming chunks */
		if (pointer == BufferLen) {
			memcpy(buffer, 
			       buffer + BufferLen - f->length,
			       f->length * sizeof(float));
			pointer = f->length;
		}
		
		id += step;
		od++;
	}
	
	f->pointer = pointer;
	
	return maxval;
}